

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O2

void __thiscall
IRBuilder::BuildElementU
          (IRBuilder *this,OpCode newOpcode,uint32 offset,RegSlot instance,
          PropertyIdIndexType propertyIdIndex)

{
  PropertyId propertyId;
  RegSlot RVar1;
  JITTimeFunctionBody *pJVar2;
  RegOpnd *newSrc;
  IntConstOpnd *newSrc_00;
  SymOpnd *dstOpnd;
  ByteCodeUsesInstr *this_00;
  SymOpnd *pSVar3;
  Instr *this_01;
  Func *pFVar4;
  int iVar5;
  undefined6 in_register_00000032;
  OpCode opcode;
  bool local_38;
  
  pJVar2 = Func::GetJITFunctionBody(this->m_func);
  propertyId = JITTimeFunctionBody::GetReferencedPropertyId(pJVar2,propertyIdIndex);
  iVar5 = (int)CONCAT62(in_register_00000032,newOpcode);
  if (iVar5 == 0xbf) {
    dstOpnd = BuildFieldOpnd(this,LdElemUndefScoped,instance,propertyId,propertyIdIndex,
                             PropertyKindData,0xffffffff);
    pSVar3 = (SymOpnd *)BuildSrcOpnd(this,1,TyVar);
    pFVar4 = this->m_func;
    opcode = LdElemUndefScoped;
  }
  else if (iVar5 == 0xc3) {
    pJVar2 = Func::GetJITFunctionBody(this->m_func);
    RVar1 = JITTimeFunctionBody::GetLocalClosureReg(pJVar2);
    dstOpnd = BuildFieldOpnd(this,StLocalFuncExpr,RVar1,propertyId,propertyIdIndex,PropertyKindData,
                             0xffffffff);
    pSVar3 = (SymOpnd *)BuildSrcOpnd(this,instance,TyVar);
    pFVar4 = this->m_func;
    opcode = StFuncExpr;
  }
  else {
    if (iVar5 == 0x12f) {
      local_38 = false;
    }
    else {
      if (iVar5 != 0x130) {
        if (iVar5 == 0x17b) {
          this_01 = IR::Instr::New(ClearAttributes,this->m_func);
          newSrc = BuildSrcOpnd(this,instance,TyVar);
          newSrc_00 = IR::IntConstOpnd::New((long)propertyId,TyInt32,this->m_func,false);
          IR::Instr::SetSrc1(this_01,&newSrc->super_Opnd);
          IR::Instr::SetSrc2(this_01,&newSrc_00->super_Opnd);
        }
        else if (iVar5 == 0x15c) {
          pFVar4 = this->m_func;
          if ((pFVar4->m_localClosureSym->field_0x19 & 0x20) != 0) {
            this_00 = IR::ByteCodeUsesInstr::New(pFVar4,offset);
            IR::ByteCodeUsesInstr::SetNonOpndSymbol
                      (this_00,(this->m_func->m_localClosureSym->super_Sym).m_id);
            AddInstr(this,&this_00->super_Instr,offset);
            pFVar4 = this->m_func;
          }
          pJVar2 = Func::GetJITFunctionBody(pFVar4);
          RVar1 = JITTimeFunctionBody::GetLocalClosureReg(pJVar2);
          pSVar3 = BuildFieldOpnd(this,LdElemUndef,RVar1,propertyId,propertyIdIndex,PropertyKindData
                                  ,0xffffffff);
          this_01 = IR::Instr::New(LdElemUndef,&pSVar3->super_Opnd,this->m_func);
        }
        else {
          pSVar3 = BuildFieldOpnd(this,newOpcode,instance,propertyId,propertyIdIndex,
                                  PropertyKindData,0xffffffff);
          this_01 = IR::Instr::New(newOpcode,&pSVar3->super_Opnd,this->m_func);
        }
        goto LAB_00497d18;
      }
      local_38 = true;
    }
    pJVar2 = Func::GetJITFunctionBody(this->m_func);
    RVar1 = JITTimeFunctionBody::GetLocalClosureReg(pJVar2);
    pSVar3 = BuildFieldOpnd(this,DeleteFld,RVar1,propertyId,propertyIdIndex,PropertyKindData,
                            0xffffffff);
    dstOpnd = (SymOpnd *)BuildDstOpnd(this,instance,TyVar,false,local_38);
    pFVar4 = this->m_func;
    opcode = DeleteFld;
  }
  this_01 = IR::Instr::New(opcode,&dstOpnd->super_Opnd,&pSVar3->super_Opnd,pFVar4);
LAB_00497d18:
  AddInstr(this,this_01,offset);
  return;
}

Assistant:

void
IRBuilder::BuildElementU(Js::OpCode newOpcode, uint32 offset, Js::RegSlot instance, Js::PropertyIdIndexType propertyIdIndex)
{
    IR::Instr *     instr;
    IR::RegOpnd *   regOpnd;
    IR::SymOpnd *   fieldSymOpnd;
    Js::PropertyId propertyId = m_func->GetJITFunctionBody()->GetReferencedPropertyId(propertyIdIndex);
    bool            reuseLoc = false;

    switch (newOpcode)
    {
        case Js::OpCode::LdLocalElemUndef:
            if (m_func->GetLocalClosureSym()->HasByteCodeRegSlot())
            {
                IR::ByteCodeUsesInstr * byteCodeUse = IR::ByteCodeUsesInstr::New(m_func, offset);
                byteCodeUse->SetNonOpndSymbol(m_func->GetLocalClosureSym()->m_id);
                this->AddInstr(byteCodeUse, offset);
            }

            instance = m_func->GetJITFunctionBody()->GetLocalClosureReg();
            newOpcode = Js::OpCode::LdElemUndef;
            fieldSymOpnd = this->BuildFieldOpnd(newOpcode, instance, propertyId, propertyIdIndex, PropertyKindData);
            instr = IR::Instr::New(newOpcode, fieldSymOpnd, m_func);
            break;

            // fall through
        case Js::OpCode::LdElemUndefScoped:
        {
             // Store
            PropertyKind propertyKind = PropertyKindData;
            fieldSymOpnd = this->BuildFieldOpnd(newOpcode, instance, propertyId, propertyIdIndex, propertyKind);
            // Implicit root object as default instance
            regOpnd = this->BuildSrcOpnd(Js::FunctionBody::RootObjectRegSlot);

            instr = IR::Instr::New(newOpcode, fieldSymOpnd, regOpnd, m_func);
            break;
        }
        case Js::OpCode::ClearAttributes:
        {
            instr = IR::Instr::New(newOpcode, m_func);
            IR::RegOpnd * src1Opnd = this->BuildSrcOpnd(instance);
            IR::IntConstOpnd * src2Opnd = IR::IntConstOpnd::New(propertyId, TyInt32, m_func);

            instr->SetSrc1(src1Opnd);
            instr->SetSrc2(src2Opnd);
            break;
        }

        case Js::OpCode::StLocalFuncExpr:
            fieldSymOpnd = this->BuildFieldOpnd(newOpcode, m_func->GetJITFunctionBody()->GetLocalClosureReg(), propertyId, propertyIdIndex, PropertyKindData);
            regOpnd = this->BuildSrcOpnd(instance);
            newOpcode = Js::OpCode::StFuncExpr;
            instr = IR::Instr::New(newOpcode, fieldSymOpnd, regOpnd, m_func);
            break;

        case Js::OpCode::DeleteLocalFld_ReuseLoc:
            newOpcode = Js::OpCode::DeleteLocalFld;
            reuseLoc = true;
            // fall through
        case Js::OpCode::DeleteLocalFld:
            newOpcode = Js::OpCode::DeleteFld;
            fieldSymOpnd = BuildFieldOpnd(newOpcode, m_func->GetJITFunctionBody()->GetLocalClosureReg(), propertyId, propertyIdIndex, PropertyKindData);
            regOpnd = BuildDstOpnd(instance, TyVar, false, reuseLoc);
            instr = IR::Instr::New(newOpcode, regOpnd, fieldSymOpnd, m_func);
            break;

        default:
        {
            fieldSymOpnd = this->BuildFieldOpnd(newOpcode, instance, propertyId, propertyIdIndex, PropertyKindData);

            instr = IR::Instr::New(newOpcode, fieldSymOpnd, m_func);
            break;
        }
    }

    this->AddInstr(instr, offset);
}